

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_log_store.cxx
# Opt level: O0

void test_log_store_pack(void)

{
  int iVar1;
  int __fd;
  string *__b;
  EVP_PKEY_CTX *ctx;
  fs_log_store *this;
  ptr<log_entry> entry2;
  ptr<log_entry> entry1;
  int i_1;
  bufptr pack;
  int logs_copied;
  ptr<log_entry> entry;
  int i;
  int logs_cnt;
  fs_log_store store1;
  fs_log_store store;
  function<int_()> rnd;
  uniform_int_distribution<int> distribution;
  default_random_engine engine;
  random_device rd;
  shared_ptr<cornerstone::log_entry> *in_stack_ffffffffffffdd88;
  function<int_()> *in_stack_ffffffffffffdd90;
  anon_class_16_2_1b063617 *in_stack_ffffffffffffdd98;
  fs_log_store *in_stack_ffffffffffffdda0;
  allocator<char> *in_stack_ffffffffffffddc0;
  allocator<char> *__a;
  char *in_stack_ffffffffffffddc8;
  allocator<char> *__s;
  random_device *in_stack_ffffffffffffddd0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  allocator<char> local_2219;
  function<int_()> *in_stack_ffffffffffffdde8;
  undefined4 in_stack_ffffffffffffde28;
  int in_stack_ffffffffffffde2c;
  fs_log_store *in_stack_ffffffffffffde30;
  int local_21bc;
  string local_21a8 [20];
  int local_2194;
  int local_2190;
  allocator<char> local_2189;
  string local_2188 [32];
  string local_2168 [8];
  ulong in_stack_ffffffffffffdea0;
  fs_log_store *in_stack_ffffffffffffdea8;
  int32 in_stack_ffffffffffffdf3c;
  ulong in_stack_ffffffffffffdf40;
  fs_log_store *in_stack_ffffffffffffdf48;
  buffer *in_stack_ffffffffffffe030;
  ulong in_stack_ffffffffffffe038;
  fs_log_store *in_stack_ffffffffffffe040;
  int in_stack_ffffffffffffe074;
  string *in_stack_ffffffffffffe078;
  fs_log_store *in_stack_ffffffffffffe080;
  allocator<char> local_1ac1;
  string local_1ac0 [32];
  fs_log_store local_1aa0;
  undefined1 local_13f9 [33];
  undefined8 local_13d8;
  undefined8 local_13d0;
  EVP_PKEY_CTX local_13c8 [36];
  undefined8 local_13a4;
  undefined8 local_1390;
  
  std::random_device::random_device(in_stack_ffffffffffffddd0);
  std::random_device::operator()((random_device *)0x13cb33);
  std::linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>::
  linear_congruential_engine
            ((linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)
             in_stack_ffffffffffffdd90,(result_type_conflict)in_stack_ffffffffffffdd88);
  std::uniform_int_distribution<int>::uniform_int_distribution
            ((uniform_int_distribution<int> *)in_stack_ffffffffffffdd90,
             (int)((ulong)in_stack_ffffffffffffdd88 >> 0x20),(int)in_stack_ffffffffffffdd88);
  local_13d8 = local_13a4;
  local_13d0 = local_1390;
  ctx = local_13c8;
  std::function<int()>::function<test_log_store_pack()::__0,void>
            ((function<int_()> *)in_stack_ffffffffffffdda0,in_stack_ffffffffffffdd98);
  cleanup(ctx);
  this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_13f9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this_00,in_stack_ffffffffffffddc8,in_stack_ffffffffffffddc0);
  cleanup((EVP_PKEY_CTX *)(local_13f9 + 1));
  std::__cxx11::string::~string((string *)(local_13f9 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_13f9);
  mkdir("tmp",0x1f6);
  __s = &local_1ac1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_00,(char *)__s,in_stack_ffffffffffffddc0);
  cornerstone::fs_log_store::fs_log_store
            (in_stack_ffffffffffffe080,in_stack_ffffffffffffe078,in_stack_ffffffffffffe074);
  std::__cxx11::string::~string(local_1ac0);
  std::allocator<char>::~allocator(&local_1ac1);
  __a = &local_2189;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_00,(char *)__s,__a);
  __b = local_2188;
  cornerstone::fs_log_store::fs_log_store
            (in_stack_ffffffffffffe080,in_stack_ffffffffffffe078,in_stack_ffffffffffffe074);
  std::__cxx11::string::~string(local_2188);
  std::allocator<char>::~allocator(&local_2189);
  iVar1 = std::function<int_()>::operator()(in_stack_ffffffffffffdd90);
  local_2190 = iVar1 % 1000 + 1000;
  for (local_2194 = 0; local_2194 < local_2190; local_2194 = local_2194 + 1) {
    rnd_entry(in_stack_ffffffffffffdde8);
    cornerstone::fs_log_store::append
              (in_stack_ffffffffffffde30,
               (ptr<log_entry> *)CONCAT44(in_stack_ffffffffffffde2c,in_stack_ffffffffffffde28));
    rnd_entry(in_stack_ffffffffffffdde8);
    __b = local_21a8;
    std::shared_ptr<cornerstone::log_entry>::operator=
              ((shared_ptr<cornerstone::log_entry> *)in_stack_ffffffffffffdd90,
               in_stack_ffffffffffffdd88);
    std::shared_ptr<cornerstone::log_entry>::~shared_ptr
              ((shared_ptr<cornerstone::log_entry> *)0x13cd8b);
    cornerstone::fs_log_store::append
              (in_stack_ffffffffffffde30,
               (ptr<log_entry> *)CONCAT44(in_stack_ffffffffffffde2c,in_stack_ffffffffffffde28));
    std::shared_ptr<cornerstone::log_entry>::~shared_ptr
              ((shared_ptr<cornerstone::log_entry> *)0x13cdac);
  }
  local_21bc = 0;
  while (local_21bc < local_2190) {
    cornerstone::fs_log_store::pack
              (in_stack_ffffffffffffdf48,in_stack_ffffffffffffdf40,in_stack_ffffffffffffdf3c);
    in_stack_ffffffffffffdda0 =
         (fs_log_store *)
         std::unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)>::operator*
                   ((unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)> *)
                    in_stack_ffffffffffffdd90);
    cornerstone::fs_log_store::apply_pack
              (in_stack_ffffffffffffe040,in_stack_ffffffffffffe038,in_stack_ffffffffffffe030);
    __b = (string *)&local_2190;
    in_stack_ffffffffffffdd90 =
         (function<int_()> *)std::min<int>((int *)&stack0xffffffffffffde2c,(int *)__b);
    local_21bc = *(int *)&(in_stack_ffffffffffffdd90->super__Function_base)._M_functor;
    std::unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)>::~unique_ptr
              ((unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)> *)
               in_stack_ffffffffffffdd90);
  }
  for (iVar1 = 1; __fd = (int)__b, iVar1 <= local_2190; iVar1 = iVar1 + 1) {
    cornerstone::fs_log_store::entry_at(in_stack_ffffffffffffdea8,in_stack_ffffffffffffdea0);
    __b = local_2168;
    cornerstone::fs_log_store::entry_at(in_stack_ffffffffffffdea8,in_stack_ffffffffffffdea0);
    std::shared_ptr<cornerstone::log_entry>::~shared_ptr
              ((shared_ptr<cornerstone::log_entry> *)0x13d06f);
    std::shared_ptr<cornerstone::log_entry>::~shared_ptr
              ((shared_ptr<cornerstone::log_entry> *)0x13d07c);
  }
  cornerstone::fs_log_store::close(&local_1aa0,__fd);
  this = (fs_log_store *)local_2168;
  cornerstone::fs_log_store::close(this,__fd);
  cleanup((EVP_PKEY_CTX *)this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_00,(char *)__s,__a);
  cleanup((EVP_PKEY_CTX *)&stack0xffffffffffffdde8);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffdde8);
  std::allocator<char>::~allocator(&local_2219);
  rmdir("tmp");
  cornerstone::fs_log_store::~fs_log_store(in_stack_ffffffffffffdda0);
  cornerstone::fs_log_store::~fs_log_store(in_stack_ffffffffffffdda0);
  std::function<int_()>::~function((function<int_()> *)0x13d152);
  std::random_device::~random_device((random_device *)0x13d15f);
  return;
}

Assistant:

void test_log_store_pack()
{
    std::random_device rd;
    std::default_random_engine engine(rd());
    std::uniform_int_distribution<int32> distribution(1, 10000);
    std::function<int32()> rnd = [distribution, engine]() mutable -> int32_t { return distribution(engine); };

    cleanup();
    cleanup("tmp");
    mkdir("tmp", 0766);
    fs_log_store store(".", 1000);
    fs_log_store store1("tmp", 1000);
    int logs_cnt = rnd() % 1000 + 1000;
    for (int i = 0; i < logs_cnt; ++i)
    {
        ptr<log_entry> entry = rnd_entry(rnd);
        store.append(entry);
        entry = rnd_entry(rnd);
        store1.append(entry);
    }

    int logs_copied = 0;
    while (logs_copied < logs_cnt)
    {
        bufptr pack = store.pack(logs_copied + 1, 100);
        store1.apply_pack(logs_copied + 1, *pack);
        logs_copied = std::min(logs_copied + 100, logs_cnt);
    }

    assert(store1.next_slot() == store.next_slot());
    for (int i = 1; i <= logs_cnt; ++i)
    {
        ptr<log_entry> entry1 = store.entry_at((ulong)i);
        ptr<log_entry> entry2 = store1.entry_at((ulong)i);
        assert(entry_equals(*entry1, *entry2));
    }

    store.close();
    store1.close();
    cleanup();
    cleanup("tmp");
    rmdir("tmp");
}